

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scriptbuilder.cpp
# Opt level: O2

void __thiscall
ScriptBuilder_AppendFunctionTest1ByOperator_Test::TestBody
          (ScriptBuilder_AppendFunctionTest1ByOperator_Test *this)

{
  _Alloc_hider lhs;
  ScriptBuilder *pSVar1;
  char *pcVar2;
  AssertHelper local_120;
  AssertionResult gtest_ar;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_108;
  string expect_asm;
  size_t expect_size;
  string expect_hex;
  Script actual;
  string pubkey_hash;
  string pubkey;
  string sig;
  
  std::__cxx11::string::string
            ((string *)&sig,
             "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e"
             ,(allocator *)&actual);
  std::__cxx11::string::string
            ((string *)&pubkey,
             "042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0"
             ,(allocator *)&actual);
  std::__cxx11::string::string
            ((string *)&pubkey_hash,"aea58b2d64af22fe06b95c46af4e471e6280226c",(allocator *)&actual)
  ;
  expect_hex._M_dataplus._M_p = (pointer)&PTR__ScriptBuilder_004530b8;
  expect_hex._M_string_length = 0;
  expect_hex.field_2._M_allocated_capacity = 0;
  expect_hex.field_2._8_8_ = 0;
  pSVar1 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<((ScriptBuilder *)&expect_hex,(string *)&sig);
  cfd::core::Pubkey::Pubkey((Pubkey *)&expect_asm,(string *)&pubkey);
  pSVar1 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar1,(Pubkey *)&expect_asm);
  gtest_ar.success_ = true;
  gtest_ar._1_7_ = 0;
  pSVar1 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar1,(long *)&gtest_ar);
  pSVar1 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar1,kOpCheckLockTimeVerify);
  pSVar1 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<
                     (pSVar1,(ScriptOperator *)&cfd::core::ScriptOperator::OP_DROP);
  pSVar1 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<
                     (pSVar1,(ScriptOperator *)&cfd::core::ScriptOperator::OP_DUP);
  pSVar1 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<
                     (pSVar1,(ScriptOperator *)&cfd::core::ScriptOperator::OP_HASH160);
  cfd::core::ByteData160::ByteData160((ByteData160 *)&local_108,(string *)&pubkey_hash);
  pSVar1 = (ScriptBuilder *)cfd::core::ScriptBuilder::operator<<(pSVar1,(ByteData160 *)&local_108);
  pSVar1 = (ScriptBuilder *)
           cfd::core::ScriptBuilder::operator<<
                     (pSVar1,(ScriptOperator *)&cfd::core::ScriptOperator::OP_EQUALVERIFY);
  cfd::core::ScriptBuilder::operator<<
            (pSVar1,(ScriptOperator *)&cfd::core::ScriptOperator::OP_CHECKSIG);
  cfd::core::ScriptBuilder::Build();
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_108);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&expect_asm);
  cfd::core::ScriptBuilder::~ScriptBuilder((ScriptBuilder *)&expect_hex);
  std::__cxx11::string::string
            ((string *)&expect_hex,
             "46304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e41042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0029000b17576a914aea58b2d64af22fe06b95c46af4e471e6280226c88ac"
             ,(allocator *)&expect_asm);
  std::__cxx11::string::string
            ((string *)&expect_asm,
             "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e 042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0 144 OP_CHECKLOCKTIMEVERIFY OP_DROP OP_DUP OP_HASH160 aea58b2d64af22fe06b95c46af4e471e6280226c OP_EQUALVERIFY OP_CHECKSIG"
             ,(allocator *)&local_108);
  lhs = expect_hex._M_dataplus;
  expect_size = 10;
  cfd::core::Script::GetHex_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"expect_hex.c_str()","actual.GetHex().c_str()",lhs._M_p,
             (char *)local_108._M_impl.super__Vector_impl_data._M_start);
  std::__cxx11::string::~string((string *)&local_108);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_108);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x96,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_108);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Script::ToString_abi_cxx11_();
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"expect_asm.c_str()","actual.ToString().c_str()",
             expect_asm._M_dataplus._M_p,(char *)local_108._M_impl.super__Vector_impl_data._M_start)
  ;
  std::__cxx11::string::~string((string *)&local_108);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_108);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x97,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_108);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  cfd::core::Script::GetElementList();
  local_120.data_ =
       (AssertHelperData *)
       (((long)local_108._M_impl.super__Vector_impl_data._M_finish -
        (long)local_108._M_impl.super__Vector_impl_data._M_start) / 0x60);
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_long>
            ((internal *)&gtest_ar,"expect_size","actual.GetElementList().size()",&expect_size,
             (unsigned_long *)&local_120);
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector
            ((vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> *)
             &local_108);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&local_108);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_120,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/p2pderivatives[P]cfd-js/external/cfd-core/test/test_scriptbuilder.cpp"
               ,0x98,pcVar2);
    testing::internal::AssertHelper::operator=(&local_120,(Message *)&local_108);
    testing::internal::AssertHelper::~AssertHelper(&local_120);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&local_108);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  std::__cxx11::string::~string((string *)&expect_asm);
  std::__cxx11::string::~string((string *)&expect_hex);
  cfd::core::Script::~Script(&actual);
  std::__cxx11::string::~string((string *)&pubkey_hash);
  std::__cxx11::string::~string((string *)&pubkey);
  std::__cxx11::string::~string((string *)&sig);
  return;
}

Assistant:

TEST(ScriptBuilder, AppendFunctionTest1ByOperator) {
  std::string sig =
  "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e";  // NOLINT
  std::string pubkey =
  "042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0";// NOLINT
  std::string pubkey_hash = "aea58b2d64af22fe06b95c46af4e471e6280226c";

  // ref: https://en.bitcoin.it/wiki/Script#Script_examples
  // Freezing funds until a time in the future
  Script actual = (ScriptBuilder() << sig << Pubkey(pubkey) << 144
      << ScriptType::kOpCheckLockTimeVerify
      << ScriptOperator::OP_DROP << ScriptOperator::OP_DUP
      << ScriptOperator::OP_HASH160 << ByteData160(pubkey_hash)
      << ScriptOperator::OP_EQUALVERIFY << ScriptOperator::OP_CHECKSIG).Build();

  std::string expect_hex =
  "46304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e41042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0029000b17576a914aea58b2d64af22fe06b95c46af4e471e6280226c88ac";// NOLINT
  std::string expect_asm =
  "304402203dd0c408e173d6b7252eabc7e3f6a0c632d930a7b343eaf60e7ebee9eb01adcc02204a567cb6a941c88f24f4c4201633468d53810fae9cdb90f35571e6b52bed005e 042322ed12f2779cae32ca89f15d61d10e3bd725d74d45269b05a34abb91b45a2ca19cc8734300deaf74d006871b5cd0730f2384037d16843663a0327fce24aef0 144 OP_CHECKLOCKTIMEVERIFY OP_DROP OP_DUP OP_HASH160 aea58b2d64af22fe06b95c46af4e471e6280226c OP_EQUALVERIFY OP_CHECKSIG";// NOLINT
  size_t expect_size = 10;

  EXPECT_STREQ(expect_hex.c_str(), actual.GetHex().c_str());
  EXPECT_STREQ(expect_asm.c_str(), actual.ToString().c_str());
  EXPECT_EQ(expect_size, actual.GetElementList().size());
}